

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# revp.c
# Opt level: O1

EVstone INT_REVcreate_auto_stone
                  (CMConnection conn,int period_sec,int period_usec,char *action_spec,
                  EVstone out_stone)

{
  int condition;
  CMFormat format;
  EVcreate_auto_stone_request request;
  EV_int_response response;
  undefined8 local_58;
  undefined8 uStack_50;
  char *local_48;
  undefined8 uStack_40;
  undefined1 local_38 [4];
  EVstone local_34;
  
  local_48 = (char *)0x0;
  uStack_40 = 0;
  local_58 = 0;
  uStack_50 = 0;
  condition = INT_CMCondition_get(conn->cm,conn);
  format = INT_CMlookup_format(conn->cm,EVcreate_auto_stone_req_formats);
  uStack_50 = CONCAT44(uStack_50._4_4_,period_usec);
  uStack_40 = CONCAT44(uStack_40._4_4_,out_stone);
  local_58 = CONCAT44(period_sec,condition);
  local_48 = action_spec;
  if (format == (CMFormat)0x0) {
    format = INT_CMregister_format(conn->cm,EVcreate_auto_stone_req_formats);
  }
  INT_CMCondition_set_client_data(conn->cm,condition,local_38);
  INT_CMwrite(conn,format,&local_58);
  INT_CMCondition_wait(conn->cm,condition);
  return local_34;
}

Assistant:

extern EVstone
INT_REVcreate_auto_stone(CMConnection conn, int period_sec, int period_usec, char *action_spec, EVstone out_stone)
{
    int cond;
    CMFormat f;
    EV_int_response response;
    EVcreate_auto_stone_request request;
    memset(&request, 0, sizeof(request));
    cond = INT_CMCondition_get(conn->cm, conn);
    f = INT_CMlookup_format(conn->cm, EVcreate_auto_stone_req_formats);
    request.period_sec = period_sec;
    request.period_usec = period_usec;
    request.action_spec = action_spec;
    request.out_stone = out_stone;
    request.condition_var = cond;
    if (f == NULL) {
        f = INT_CMregister_format(conn->cm, EVcreate_auto_stone_req_formats);
    }
    INT_CMCondition_set_client_data(conn->cm, cond, &response);
    INT_CMwrite(conn, f, &request);
    INT_CMCondition_wait(conn->cm, cond);
    return (EVstone) response.ret;
}